

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprImpliesExpr(Parse *pParse,Expr *pE1,Expr *pE2,int iTab)

{
  int iVar1;
  Expr *pA;
  undefined4 in_ECX;
  Expr *in_RDX;
  Parse *in_RSI;
  Expr *pX;
  Expr *in_stack_ffffffffffffffc8;
  Expr *in_stack_ffffffffffffffd0;
  int iTab_00;
  undefined4 in_stack_ffffffffffffffd8;
  int local_4;
  
  iVar1 = sqlite3ExprCompare((Parse *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                             in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0);
  iTab_00 = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  if (iVar1 == 0) {
    local_4 = 1;
  }
  else if ((in_RDX->op == '+') &&
          ((iVar1 = sqlite3ExprImpliesExpr
                              (in_RSI,in_RDX,(Expr *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                               iTab_00), iVar1 != 0 ||
           (iVar1 = sqlite3ExprImpliesExpr
                              (in_RSI,in_RDX,(Expr *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                               iTab_00), iVar1 != 0)))) {
    local_4 = 1;
  }
  else {
    if ((in_RDX->op == '3') && ((*(char *)&in_RSI->db != '2' && (*(char *)&in_RSI->db != '-')))) {
      pA = sqlite3ExprSkipCollate((Expr *)in_RSI->pVdbe);
      iVar1 = sqlite3ExprCompare((Parse *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),pA,
                                 in_stack_ffffffffffffffc8,0);
      if (iVar1 == 0) {
        return 1;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprImpliesExpr(Parse *pParse, Expr *pE1, Expr *pE2, int iTab){
  if( sqlite3ExprCompare(pParse, pE1, pE2, iTab)==0 ){
    return 1;
  }
  if( pE2->op==TK_OR
   && (sqlite3ExprImpliesExpr(pParse, pE1, pE2->pLeft, iTab)
             || sqlite3ExprImpliesExpr(pParse, pE1, pE2->pRight, iTab) )
  ){
    return 1;
  }
  if( pE2->op==TK_NOTNULL && pE1->op!=TK_ISNULL && pE1->op!=TK_IS ){
    Expr *pX = sqlite3ExprSkipCollate(pE1->pLeft);
    testcase( pX!=pE1->pLeft );
    if( sqlite3ExprCompare(pParse, pX, pE2->pLeft, iTab)==0 ) return 1;
  }
  return 0;
}